

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::GLMClassifier::MergePartialFromCodedStream
          (GLMClassifier *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint32 uVar5;
  undefined8 in_RAX;
  GLMClassifier_DoubleArray *value_00;
  Int64Vector *value_01;
  StringVector *value_02;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  int value_1;
  int value;
  
  _value_1 = in_RAX;
LAB_0057b054:
  do {
    pbVar3 = input->buffer_;
    uVar5 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar8 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar7 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar5 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar5 = uVar7, (~(uint)*pbVar1 & uVar7) < 0x80))
        goto LAB_0057b1e1;
        uVar8 = (ulong)((uVar7 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar8 = uVar8 | 0x100000000;
    }
    else {
LAB_0057b1e1:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x3fff) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    uVar5 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) goto LAB_0057b0b1;
    uVar7 = (uint)(uVar8 >> 3) & 0x1fffffff;
    cVar6 = (char)uVar8;
    switch(uVar7) {
    case 1:
      if (cVar6 != '\n') goto LAB_0057b0b1;
      value_00 = google::protobuf::
                 RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::Add
                           (&this->weights_);
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::GLMClassifier_DoubleArray>(input,value_00)
      ;
      break;
    case 2:
      if (cVar6 == '\x11') {
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (1,0x12,input,&this->offset_);
      }
      else {
        if ((uVar5 & 0xff) != 0x12) goto LAB_0057b0b1;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (input,&this->offset_);
      }
      break;
    case 3:
      if (cVar6 != '\x18') goto LAB_0057b0b1;
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (input,&value);
      if (!bVar4) {
        return false;
      }
      this->postevaluationtransform_ = value;
      goto LAB_0057b054;
    case 4:
      if (cVar6 == ' ') {
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,&value_1);
        if (!bVar4) {
          return false;
        }
        this->classencoding_ = value_1;
        goto LAB_0057b054;
      }
LAB_0057b0b1:
      if (uVar5 == 0) {
        return true;
      }
      if ((uVar5 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
      break;
    default:
      if (uVar7 == 100) {
        if (cVar6 != '\"') goto LAB_0057b0b1;
        value_02 = mutable_stringclasslabels(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::StringVector>(input,value_02);
      }
      else {
        if ((uVar7 != 0x65) || (cVar6 != '*')) goto LAB_0057b0b1;
        value_01 = mutable_int64classlabels(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::Int64Vector>(input,value_01);
      }
    }
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool GLMClassifier::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.GLMClassifier)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.GLMClassifier.DoubleArray weights = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double offset = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_offset())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(17u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 18u, input, this->mutable_offset())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMClassifier.PostEvaluationTransform postEvaluationTransform = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_postevaluationtransform(static_cast< ::CoreML::Specification::GLMClassifier_PostEvaluationTransform >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMClassifier.ClassEncoding classEncoding = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_classencoding(static_cast< ::CoreML::Specification::GLMClassifier_ClassEncoding >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.GLMClassifier)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.GLMClassifier)
  return false;
#undef DO_
}